

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  bool bVar1;
  DeathTestOutcome DVar2;
  string *output;
  RE *this_00;
  ostream *this_01;
  byte in_SIL;
  DeathTestImpl *in_RDI;
  bool matched;
  Message buffer;
  bool success;
  string error_message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  RE *in_stack_fffffffffffffdc0;
  Message *in_stack_fffffffffffffdc8;
  Message *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  int exit_code;
  string *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  undefined8 in_stack_fffffffffffffe38;
  GTestLogSeverity severity;
  GTestLog *in_stack_fffffffffffffe40;
  string local_158 [36];
  GTestLog local_134;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  char *local_d0;
  undefined1 local_c1;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  char *local_60;
  byte local_39;
  string local_38 [39];
  byte local_11;
  byte local_1;
  
  exit_code = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  severity = (GTestLogSeverity)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  local_11 = in_SIL & 1;
  bVar1 = spawned(in_RDI);
  if (bVar1) {
    GetCapturedStderr_abi_cxx11_();
    local_39 = 0;
    Message::Message(in_stack_fffffffffffffdf0);
    Message::operator<<((Message *)in_stack_fffffffffffffdc0,
                        (char (*) [13])in_stack_fffffffffffffdb8);
    local_60 = statement(in_RDI);
    Message::operator<<((Message *)in_stack_fffffffffffffdc0,(char **)in_stack_fffffffffffffdb8);
    Message::operator<<((Message *)in_stack_fffffffffffffdc0,(char (*) [2])in_stack_fffffffffffffdb8
                       );
    DVar2 = outcome(in_RDI);
    switch(DVar2) {
    case IN_PROGRESS:
    default:
      GTestLog::GTestLog(in_stack_fffffffffffffe40,severity,
                         (char *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                         (int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
      this_01 = GTestLog::GetStream(&local_134);
      std::operator<<(this_01,"DeathTest::Passed somehow called before conclusion of test");
      GTestLog::~GTestLog((GTestLog *)this_01);
      break;
    case DIED:
      if ((local_11 & 1) == 0) {
        Message::operator<<((Message *)in_stack_fffffffffffffdc0,
                            (char (*) [51])in_stack_fffffffffffffdb8);
        Message::operator<<((Message *)in_stack_fffffffffffffdc0,
                            (char (*) [13])in_stack_fffffffffffffdb8);
        status(in_RDI);
        ExitSummary_abi_cxx11_(exit_code);
        Message::operator<<((Message *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        Message::operator<<((Message *)in_stack_fffffffffffffdc0,
                            (char (*) [2])in_stack_fffffffffffffdb8);
        in_stack_fffffffffffffdc8 =
             Message::operator<<((Message *)in_stack_fffffffffffffdc0,
                                 (char (*) [13])in_stack_fffffffffffffdb8);
        FormatDeathTestOutput(in_stack_fffffffffffffe28);
        Message::operator<<((Message *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        std::__cxx11::string::~string(local_130);
        std::__cxx11::string::~string(local_110);
      }
      else {
        std::__cxx11::string::c_str();
        regex(in_RDI);
        local_c1 = RE::PartialMatch((char *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
        if ((bool)local_c1) {
          local_39 = 1;
        }
        else {
          output = (string *)
                   Message::operator<<((Message *)in_stack_fffffffffffffdc0,
                                       (char (*) [47])in_stack_fffffffffffffdb8);
          Message::operator<<((Message *)in_stack_fffffffffffffdc0,
                              (char (*) [13])in_stack_fffffffffffffdb8);
          this_00 = regex(in_RDI);
          local_d0 = RE::pattern(this_00);
          Message::operator<<((Message *)in_stack_fffffffffffffdc0,
                              (char **)in_stack_fffffffffffffdb8);
          Message::operator<<((Message *)in_stack_fffffffffffffdc0,
                              (char (*) [2])in_stack_fffffffffffffdb8);
          Message::operator<<((Message *)in_stack_fffffffffffffdc0,
                              (char (*) [13])in_stack_fffffffffffffdb8);
          FormatDeathTestOutput(output);
          Message::operator<<((Message *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
          std::__cxx11::string::~string(local_f0);
        }
      }
      break;
    case LIVED:
      Message::operator<<((Message *)in_stack_fffffffffffffdc0,
                          (char (*) [28])in_stack_fffffffffffffdb8);
      Message::operator<<((Message *)in_stack_fffffffffffffdc0,
                          (char (*) [13])in_stack_fffffffffffffdb8);
      FormatDeathTestOutput(in_stack_fffffffffffffe28);
      Message::operator<<((Message *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      std::__cxx11::string::~string(local_80);
      break;
    case RETURNED:
      Message::operator<<((Message *)in_stack_fffffffffffffdc0,
                          (char (*) [47])in_stack_fffffffffffffdb8);
      Message::operator<<((Message *)in_stack_fffffffffffffdc0,
                          (char (*) [13])in_stack_fffffffffffffdb8);
      FormatDeathTestOutput(in_stack_fffffffffffffe28);
      Message::operator<<((Message *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      std::__cxx11::string::~string(local_c0);
      break;
    case THREW:
      Message::operator<<((Message *)in_stack_fffffffffffffdc0,
                          (char (*) [33])in_stack_fffffffffffffdb8);
      Message::operator<<((Message *)in_stack_fffffffffffffdc0,
                          (char (*) [13])in_stack_fffffffffffffdb8);
      FormatDeathTestOutput(in_stack_fffffffffffffe28);
      Message::operator<<((Message *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      std::__cxx11::string::~string(local_a0);
    }
    Message::GetString_abi_cxx11_(in_stack_fffffffffffffdc8);
    DeathTest::set_last_death_test_message((string *)0x15a169);
    std::__cxx11::string::~string(local_158);
    local_1 = local_39 & 1;
    Message::~Message((Message *)0x15a195);
    std::__cxx11::string::~string(local_38);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const std::string error_message = GetCapturedStderr();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
        const bool matched = RE::PartialMatch(error_message.c_str(), *regex());
        if (matched) {
          success = true;
        } else {
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << regex()->pattern() << "\n"
                 << "Actual msg:\n" << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n" << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}